

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PackedArrayType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange,unsigned_int&>
          (BumpAllocator *this,Type *args,ConstantRange *args_1,uint *args_2)

{
  PackedArrayType *this_00;
  
  this_00 = (PackedArrayType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PackedArrayType *)this->endPtr < this_00 + 1) {
    this_00 = (PackedArrayType *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::PackedArrayType::PackedArrayType(this_00,args,*args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }